

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

size_t __thiscall
google::protobuf::internal::DynamicMapField::SpaceUsedExcludingSelfNoLock(DynamicMapField *this)

{
  RepeatedPtrFieldBase *this_00;
  size_type sVar1;
  CppType CVar2;
  size_t sVar3;
  Message *message;
  size_t sVar4;
  long lVar5;
  Reflection *this_01;
  const_iterator it;
  
  this_00 = &((this->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).super_MapFieldBase.repeated_field_)->super_RepeatedPtrFieldBase;
  if (this_00 == (RepeatedPtrFieldBase *)0x0) {
    sVar3 = 0x30;
  }
  else {
    sVar3 = RepeatedPtrFieldBase::
            SpaceUsedExcludingSelfLong<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
                      (this_00);
    sVar3 = sVar3 + 0x30;
  }
  sVar1 = (this->map_).elements_.num_elements_;
  if (sVar1 != 0) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
    ::iterator_base(&it.it_,&(this->map_).elements_);
    CVar2 = MapKey::type((MapKey *)it.it_.node_);
    lVar5 = 0;
    if (CVar2 == CPPTYPE_STRING) {
      lVar5 = sVar1 * 0x20;
    }
    sVar3 = sVar3 + sVar1 * 0x38 + lVar5;
    CVar2 = MapValueConstRef::type((MapValueConstRef *)&(it.it_.node_)->field_0x28);
    switch(CVar2) {
    case CPPTYPE_INT32:
    case CPPTYPE_UINT32:
    case CPPTYPE_FLOAT:
    case CPPTYPE_ENUM:
      sVar3 = sVar3 + sVar1 * 4;
      break;
    case CPPTYPE_INT64:
    case CPPTYPE_UINT64:
    case CPPTYPE_DOUBLE:
      sVar3 = sVar3 + sVar1 * 8;
      break;
    case CPPTYPE_BOOL:
      sVar3 = sVar3 + sVar1;
      break;
    case CPPTYPE_STRING:
      sVar3 = sVar3 + sVar1 * 0x20;
      break;
    case CPPTYPE_MESSAGE:
      while (it.it_.node_ != (Node *)0x0) {
        message = MapValueConstRef::GetMessageValue((MapValueConstRef *)&(it.it_.node_)->field_0x28)
        ;
        (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
        sVar4 = Reflection::SpaceUsedLong(this_01,message);
        sVar3 = sVar3 + sVar4;
        Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
        iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
        ::operator++(&it.it_);
      }
    }
  }
  return sVar3;
}

Assistant:

size_t DynamicMapField::SpaceUsedExcludingSelfNoLock() const {
  size_t size = 0;
  if (MapFieldBase::repeated_field_ != nullptr) {
    size += MapFieldBase::repeated_field_->SpaceUsedExcludingSelfLong();
  }
  size += sizeof(map_);
  size_t map_size = map_.size();
  if (map_size) {
    Map<MapKey, MapValueRef>::const_iterator it = map_.begin();
    size += sizeof(it->first) * map_size;
    size += sizeof(it->second) * map_size;
    // If key is string, add the allocated space.
    if (it->first.type() == FieldDescriptor::CPPTYPE_STRING) {
      size += sizeof(std::string) * map_size;
    }
    // Add the allocated space in MapValueRef.
    switch (it->second.type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)           \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: { \
    size += sizeof(TYPE) * map_size;         \
    break;                                   \
  }
      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(STRING, std::string);
      HANDLE_TYPE(ENUM, int32_t);
#undef HANDLE_TYPE
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        while (it != map_.end()) {
          const Message& message = it->second.GetMessageValue();
          size += message.GetReflection()->SpaceUsedLong(message);
          ++it;
        }
        break;
      }
    }
  }
  return size;
}